

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::FdObserver::fire(FdObserver *this,short events)

{
  PromiseFulfiller<void> *pPVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_38;
  
  if ((events & 0x2019U) != 0) {
    if ((this->atEnd).ptr.isSet == true) {
      (this->atEnd).ptr.isSet = false;
    }
    (this->atEnd).ptr.field_1.value = (events & 0x2010U) != 0;
    (this->atEnd).ptr.isSet = true;
    pPVar1 = (this->readFulfiller).ptr.ptr;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_38);
      local_38.disposer = (Disposer *)0x0;
      local_38.ptr = (PromiseFulfiller<void> *)0x0;
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
                (&(this->readFulfiller).ptr,&local_38);
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_38);
    }
  }
  pPVar1 = (this->writeFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0 && (events & 0x1cU) != 0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->writeFulfiller).ptr,&local_38);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_38);
  }
  pPVar1 = (this->hupFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0 && (events & 0x18U) != 0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=(&(this->hupFulfiller).ptr,&local_38);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_38);
  }
  pPVar1 = (this->urgentFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0 && (events & 2U) != 0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->urgentFulfiller).ptr,&local_38);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_38);
  }
  return;
}

Assistant:

void UnixEventPort::FdObserver::fire(short events) {
  if (events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR)) {
    if (events & (EPOLLHUP | EPOLLRDHUP)) {
      atEnd = true;
    } else {
      // Since we didn't receive EPOLLRDHUP, we know that we're not at the end.
      atEnd = false;
    }

    KJ_IF_SOME(f, readFulfiller) {
      f->fulfill();
      readFulfiller = kj::none;
    }
  }

  if (events & (EPOLLOUT | EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, writeFulfiller) {
      f->fulfill();
      writeFulfiller = kj::none;
    }
  }

  if (events & (EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, hupFulfiller) {
      f->fulfill();
      hupFulfiller = kj::none;
    }
  }

  if (events & EPOLLPRI) {
    KJ_IF_SOME(f, urgentFulfiller) {
      f->fulfill();
      urgentFulfiller = kj::none;
    }
  }
}